

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Update
          (PersistentStorageJson *this,BorderRouter *aValue)

{
  Status SVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,JSON_BR_abi_cxx11_,DAT_003a3bc8 + JSON_BR_abi_cxx11_);
  SVar1 = UpdId<ot::commissioner::persistent_storage::BorderRouter>(this,aValue,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Update(BorderRouter const &aValue)
{
    return UpdId<BorderRouter>(aValue, JSON_BR);
}